

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::evaluateFileInto
          (QMakeEvaluator *this,QString *fileName,ProValueMap *values,LoadFlags flags)

{
  bool bVar1;
  const_iterator o;
  ProString *this_00;
  QMakeGlobals *in_RDX;
  QMakeEvaluator *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  ProString *ifn;
  ProStringList *__range1;
  ProStringList *iif;
  VisitReturn ret;
  const_iterator __end1;
  const_iterator __begin1;
  ProStringList ifns;
  ProKey qiif;
  QMakeEvaluator visitor;
  ProString *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  ProKey *in_stack_fffffffffffffc88;
  QMakeHandler *in_stack_fffffffffffffc90;
  QMakeVfs *in_stack_fffffffffffffc98;
  ProKey *key;
  undefined4 in_stack_fffffffffffffca0;
  EvalFileType in_stack_fffffffffffffca4;
  VisitReturn local_33c;
  const_iterator local_328 [4];
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [44];
  QFlagsStorage<QMakeEvaluator::LoadFlag> in_stack_fffffffffffffd3c;
  undefined1 local_2b8 [112];
  QString aQStack_248 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_2b8,0xaa,0x2b0);
  QMakeEvaluator(in_RSI,in_RDX,
                 (QMakeParser *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  QString::operator=(aQStack_248,(QString *)&in_RDI->m_outputDir);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::operator=
            ((QExplicitlySharedDataPointer<QMakeFeatureRoots> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (QExplicitlySharedDataPointer<QMakeFeatureRoots> *)in_stack_fffffffffffffc68);
  local_33c = evaluateFileChecked(in_RSI,(QString *)in_RDX,in_stack_fffffffffffffca4,
                                  (LoadFlags)in_stack_fffffffffffffd3c.i);
  if (local_33c == ReturnTrue) {
    ProValueMapStack::top((ProValueMapStack *)0x2ff553);
    QMap<ProKey,_ProStringList>::operator=
              ((QMap<ProKey,_ProStringList> *)
               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffc68);
    memset(local_2f0,0xaa,0x30);
    ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   (char *)in_stack_fffffffffffffc68);
    key = (ProKey *)0xaaaaaaaaaaaaaaaa;
    std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
    front((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
          CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    QMap<ProKey,_ProStringList>::operator[]
              ((QMap<ProKey,_ProStringList> *)CONCAT44(local_33c,in_stack_fffffffffffffca0),key);
    local_308 = 0xaaaaaaaaaaaaaaaa;
    local_300 = 0xaaaaaaaaaaaaaaaa;
    local_2f8 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x2ff601);
    QMap<ProKey,_ProStringList>::value
              ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (ProStringList *)in_RDI);
    ProStringList::~ProStringList((ProStringList *)0x2ff62a);
    local_328[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_328[0] = QList<ProString>::begin
                             ((QList<ProString> *)
                              CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    o = QList<ProString>::end
                  ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                  );
    while (bVar1 = QList<ProString>::const_iterator::operator!=(local_328,o), bVar1) {
      this_00 = QList<ProString>::const_iterator::operator*(local_328);
      bVar1 = ProStringList::contains
                        ((ProStringList *)this_00,(ProString *)in_RDI,
                         (CaseSensitivity)((ulong)in_RDX >> 0x20));
      if (!bVar1) {
        ProStringList::operator<<
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
      }
      QList<ProString>::const_iterator::operator++(local_328);
    }
    local_33c = ReturnTrue;
    ProStringList::~ProStringList((ProStringList *)0x2ff70b);
    ProKey::~ProKey((ProKey *)0x2ff718);
  }
  ~QMakeEvaluator(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_33c;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFileInto(
        const QString &fileName, ProValueMap *values, LoadFlags flags)
{
    QMakeEvaluator visitor(m_option, m_parser, m_vfs, m_handler);
    visitor.m_caller = this;
    visitor.m_outputDir = m_outputDir;
    visitor.m_featureRoots = m_featureRoots;
    VisitReturn ret = visitor.evaluateFileChecked(fileName, QMakeHandler::EvalAuxFile, flags);
    if (ret != ReturnTrue)
        return ret;
    *values = visitor.m_valuemapStack.top();
    ProKey qiif("QMAKE_INTERNAL_INCLUDED_FILES");
    ProStringList &iif = m_valuemapStack.front()[qiif];
    const auto ifns = values->value(qiif);
    for (const ProString &ifn : ifns)
        if (!iif.contains(ifn))
            iif << ifn;
    return ReturnTrue;
}